

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_parser_t * mpc_re_mode(char *re,int mode)

{
  int iVar1;
  mpc_parser_t *pmVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  mpc_parser_t *pmVar5;
  mpc_parser_t *pmVar6;
  undefined8 *puVar7;
  mpc_parser_t *pmVar8;
  undefined8 *puVar9;
  mpc_input_t *i;
  char *__ptr;
  mpc_result_t mVar10;
  mpc_result_t r;
  mpc_result_t local_80;
  mpc_parser_t *local_78;
  int local_6c;
  mpc_parser_t *local_68;
  mpc_parser_t *local_60;
  mpc_parser_t *local_58;
  mpc_parser_t *local_50;
  mpc_parser_t *local_48;
  mpc_parser_t *local_40;
  char *local_38;
  
  local_6c = mode;
  local_38 = re;
  pmVar2 = mpc_new("regex");
  pmVar3 = mpc_new("term");
  pmVar4 = mpc_new("factor");
  pmVar5 = mpc_new("base");
  local_40 = pmVar5;
  local_68 = mpc_new("range");
  pmVar6 = mpc_char('|');
  local_78 = pmVar2;
  pmVar6 = mpc_and(2,mpcf_snd_free,pmVar6,pmVar2,free);
  puVar7 = (undefined8 *)calloc(1,0x38);
  *puVar7 = 0;
  *(undefined2 *)(puVar7 + 6) = 0x13;
  puVar7[1] = pmVar6;
  puVar7[3] = mpcf_ctor_null;
  local_58 = pmVar3;
  pmVar6 = mpc_and(2,mpcf_re_or,pmVar3,puVar7,mpc_delete);
  mpc_define(pmVar2,pmVar6);
  pmVar2 = (mpc_parser_t *)calloc(1,0x38);
  pmVar2->name = (char *)0x0;
  pmVar2->type = '\x14';
  pmVar2->retained = '\0';
  (pmVar2->data).repeat.x = pmVar4;
  (pmVar2->data).apply.f = mpcf_re_and;
  local_60 = pmVar4;
  mpc_define(pmVar3,pmVar2);
  pmVar2 = mpc_char('*');
  pmVar3 = mpc_char('+');
  pmVar6 = mpc_char('?');
  pmVar8 = mpc_int();
  pmVar8 = mpc_between(pmVar8,free,"{","}");
  puVar7 = (undefined8 *)calloc(1,0x38);
  *puVar7 = 0;
  *(undefined2 *)(puVar7 + 6) = 1;
  pmVar2 = mpc_or(5,pmVar2,pmVar3,pmVar6,pmVar8,puVar7);
  pmVar2 = mpc_and(2,mpcf_re_repeat,pmVar5,pmVar2,mpc_delete);
  mpc_define(pmVar4,pmVar2);
  local_48 = mpc_between(local_78,mpc_delete,"(",")");
  local_50 = mpc_between(local_68,mpc_delete,"[","]");
  pmVar2 = mpc_escape();
  puVar7 = (undefined8 *)calloc(1,0x38);
  *puVar7 = 0;
  *(undefined2 *)(puVar7 + 6) = 0x10;
  puVar7[1] = pmVar2;
  puVar7[2] = mpcf_re_escape;
  puVar7[3] = &local_6c;
  pmVar3 = mpc_noneof(")|");
  puVar9 = (undefined8 *)calloc(1,0x38);
  pmVar2 = local_78;
  *puVar9 = 0;
  *(undefined2 *)(puVar9 + 6) = 0x10;
  puVar9[1] = pmVar3;
  puVar9[2] = mpcf_re_escape;
  puVar9[3] = &local_6c;
  pmVar3 = mpc_or(4,local_48,local_50,puVar7,puVar9);
  pmVar4 = local_40;
  mpc_define(local_40,pmVar3);
  pmVar3 = mpc_escape();
  pmVar5 = mpc_noneof("]");
  pmVar3 = mpc_or(2,pmVar3,pmVar5);
  pmVar5 = (mpc_parser_t *)calloc(1,0x38);
  pmVar5->name = (char *)0x0;
  pmVar5->type = '\x14';
  pmVar5->retained = '\0';
  (pmVar5->data).repeat.x = pmVar3;
  (pmVar5->data).apply.f = mpcf_strfold;
  pmVar6 = (mpc_parser_t *)calloc(1,0x38);
  pmVar3 = local_68;
  pmVar6->name = (char *)0x0;
  pmVar6->type = '\x0f';
  pmVar6->retained = '\0';
  (pmVar6->data).expect.x = pmVar5;
  (pmVar6->data).apply.f = mpcf_re_range;
  mpc_define(local_68,pmVar6);
  pmVar5 = (mpc_parser_t *)calloc(1,0x38);
  pmVar5->name = (char *)0x0;
  pmVar5->type = '\x11';
  pmVar5->retained = '\0';
  (pmVar5->data).expect.x = pmVar2;
  pmVar5 = mpc_whole(pmVar5,mpc_delete);
  mpc_optimise_unretained(pmVar5,1);
  mpc_optimise_unretained(pmVar2,1);
  mpc_optimise_unretained(local_58,1);
  mpc_optimise_unretained(local_60,1);
  mpc_optimise_unretained(pmVar4,1);
  mpc_optimise_unretained(pmVar3,1);
  i = mpc_input_new_string("<mpc_re_compiler>",local_38);
  iVar1 = mpc_parse_input(i,pmVar5,&local_80);
  mpc_input_delete(i);
  if (iVar1 == 0) {
    __ptr = mpc_err_string(local_80.error);
    mVar10.error = (mpc_err_t *)mpc_failf("Invalid Regex: %s",__ptr);
    mpc_err_delete(local_80.error);
    free(__ptr);
    local_80.error = mVar10.error;
  }
  mpc_cleanup(6,pmVar5,local_78,local_58,local_60,pmVar4,pmVar3);
  mpc_optimise_unretained((mpc_parser_t *)local_80.error,1);
  return (mpc_parser_t *)local_80.error;
}

Assistant:

mpc_parser_t *mpc_re_mode(const char *re, int mode) {

  char *err_msg;
  mpc_parser_t *err_out;
  mpc_result_t r;
  mpc_parser_t *Regex, *Term, *Factor, *Base, *Range, *RegexEnclose;

  Regex  = mpc_new("regex");
  Term   = mpc_new("term");
  Factor = mpc_new("factor");
  Base   = mpc_new("base");
  Range  = mpc_new("range");

  mpc_define(Regex, mpc_and(2, mpcf_re_or,
    Term,
    mpc_maybe(mpc_and(2, mpcf_snd_free, mpc_char('|'), Regex, free)),
    (mpc_dtor_t)mpc_delete
  ));

  mpc_define(Term, mpc_many(mpcf_re_and, Factor));

  mpc_define(Factor, mpc_and(2, mpcf_re_repeat,
    Base,
    mpc_or(5,
      mpc_char('*'), mpc_char('+'), mpc_char('?'),
      mpc_brackets(mpc_int(), free),
      mpc_pass()),
    (mpc_dtor_t)mpc_delete
  ));

  mpc_define(Base, mpc_or(4,
    mpc_parens(Regex, (mpc_dtor_t)mpc_delete),
    mpc_squares(Range, (mpc_dtor_t)mpc_delete),
    mpc_apply_to(mpc_escape(), mpcf_re_escape, &mode),
    mpc_apply_to(mpc_noneof(")|"), mpcf_re_escape, &mode)
  ));

  mpc_define(Range, mpc_apply(
    mpc_many(mpcf_strfold, mpc_or(2, mpc_escape(), mpc_noneof("]"))),
    mpcf_re_range
  ));

  RegexEnclose = mpc_whole(mpc_predictive(Regex), (mpc_dtor_t)mpc_delete);

  mpc_optimise(RegexEnclose);
  mpc_optimise(Regex);
  mpc_optimise(Term);
  mpc_optimise(Factor);
  mpc_optimise(Base);
  mpc_optimise(Range);

  if(!mpc_parse("<mpc_re_compiler>", re, RegexEnclose, &r)) {
    err_msg = mpc_err_string(r.error);
    err_out = mpc_failf("Invalid Regex: %s", err_msg);
    mpc_err_delete(r.error);
    free(err_msg);
    r.output = err_out;
  }

  mpc_cleanup(6, RegexEnclose, Regex, Term, Factor, Base, Range);

  mpc_optimise(r.output);

  return r.output;

}